

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

void __thiscall llvm::AppleAcceleratorTable::dump(AppleAcceleratorTable *this,raw_ostream *OS)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_t Value;
  SmallVector<std::pair<unsigned_short,_llvm::dwarf::Form>,_3U> *this_00;
  const_iterator ppVar5;
  raw_ostream *prVar6;
  long lVar7;
  StringRef local_3b8;
  ulong local_3a8;
  Twine local_3a0;
  Twine local_388;
  Twine local_370;
  string local_358;
  StringRef local_338;
  DelimitedScope<_[_,__]_> local_328;
  ListScope HashScope;
  uint64_t DataOffset;
  uint64_t uStack_310;
  uint32_t Hash;
  uint64_t OffsetsOffset;
  uint64_t HashOffset;
  uint HashIdx;
  Twine local_2e8;
  Twine local_2d0;
  Twine local_2b8;
  string local_2a0;
  StringRef local_280;
  DelimitedScope<_[_,__]_> local_270;
  ListScope BucketScope;
  uint Index;
  uint Bucket;
  uint64_t OffsetsBase;
  uint64_t HashesBase;
  uint64_t Offset;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Form_&>_>_>
  local_218;
  Atom local_1c4;
  Twine local_1c0;
  Twine local_1a8;
  Twine local_190;
  string local_178;
  StringRef local_158;
  DelimitedScope<___,____> local_148;
  DictScope AtomScope;
  pair<unsigned_short,_llvm::dwarf::Form> *Atom;
  const_iterator __end1;
  const_iterator __begin1;
  SmallVector<std::pair<unsigned_short,_llvm::dwarf::Form>,_3U> *__range1;
  uint i;
  StringRef local_110;
  DelimitedScope<_[_,__]_> local_100;
  ListScope AtomsScope;
  SmallVector<llvm::DWARFFormValue,_3U> AtomForms;
  StringRef local_48;
  undefined1 local_38 [8];
  ScopedPrinter W;
  raw_ostream *OS_local;
  AppleAcceleratorTable *this_local;
  
  if ((this->IsValid & 1U) != 0) {
    W.Prefix.Length = (size_t)OS;
    ScopedPrinter::ScopedPrinter((ScopedPrinter *)local_38,OS);
    Header::dump(&this->Hdr,(ScopedPrinter *)local_38);
    StringRef::StringRef(&local_48,"DIE offset base");
    ScopedPrinter::printNumber((ScopedPrinter *)local_38,local_48,(this->HdrData).DIEOffsetBase);
    StringRef::StringRef
              ((StringRef *)
               (AtomForms.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts[2].buffer +
               0x28),"Number of atoms");
    Value = SmallVectorBase::size((SmallVectorBase *)&(this->HdrData).Atoms);
    ScopedPrinter::printNumber((ScopedPrinter *)local_38,stack0xffffffffffffffa8,Value);
    SmallVector<llvm::DWARFFormValue,_3U>::SmallVector
              ((SmallVector<llvm::DWARFFormValue,_3U> *)&AtomsScope);
    StringRef::StringRef(&local_110,"Atoms");
    DelimitedScope<'[',_']'>::DelimitedScope(&local_100,(ScopedPrinter *)local_38,local_110);
    __range1._0_4_ = 0;
    this_00 = &(this->HdrData).Atoms;
    __end1 = SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>::begin
                       ((SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                         *)this_00);
    ppVar5 = SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>::end
                       ((SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                         *)this_00);
    for (; __end1 != ppVar5; __end1 = __end1 + 1) {
      AtomScope.W = (ScopedPrinter *)__end1;
      Twine::Twine(&local_1a8,"Atom ");
      Twine::Twine(&local_1c0,(uint)__range1);
      llvm::operator+(&local_190,&local_1a8,&local_1c0);
      Twine::str_abi_cxx11_(&local_178,&local_190);
      StringRef::StringRef(&local_158,&local_178);
      DelimitedScope<'{',_'}'>::DelimitedScope(&local_148,(ScopedPrinter *)local_38,local_158);
      std::__cxx11::string::~string((string *)&local_178);
      prVar6 = ScopedPrinter::startLine((ScopedPrinter *)local_38);
      prVar6 = raw_ostream::operator<<(prVar6,"Type: ");
      local_1c4 = formatAtom((uint)*(ushort *)&(AtomScope.W)->OS);
      prVar6 = anon_unknown.dwarf_33be006::operator<<(prVar6,&local_1c4);
      raw_ostream::operator<<(prVar6,'\n');
      prVar6 = ScopedPrinter::startLine((ScopedPrinter *)local_38);
      prVar6 = raw_ostream::operator<<(prVar6,"Form: ");
      formatv<const_llvm::dwarf::Form_&>(&local_218,"{0}",(Form *)((long)&(AtomScope.W)->OS + 2));
      prVar6 = raw_ostream::operator<<(prVar6,&local_218.super_formatv_object_base);
      raw_ostream::operator<<(prVar6,'\n');
      formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Form_&>_>_>
      ::~formatv_object(&local_218);
      DWARFFormValue::DWARFFormValue
                ((DWARFFormValue *)&Offset,*(Form *)((long)&(AtomScope.W)->OS + 2));
      SmallVectorTemplateBase<llvm::DWARFFormValue,_true>::push_back
                ((SmallVectorTemplateBase<llvm::DWARFFormValue,_true> *)&AtomsScope,
                 (DWARFFormValue *)&Offset);
      DelimitedScope<'{',_'}'>::~DelimitedScope(&local_148);
      __range1._0_4_ = (uint)__range1 + 1;
    }
    DelimitedScope<'[',_']'>::~DelimitedScope(&local_100);
    HashesBase = (ulong)(this->Hdr).HeaderDataLength + 0x14;
    lVar7 = HashesBase + ((this->Hdr).BucketCount << 2);
    uVar1 = (this->Hdr).HashCount;
    for (BucketScope.W._4_4_ = 0; BucketScope.W._4_4_ < (this->Hdr).BucketCount;
        BucketScope.W._4_4_ = BucketScope.W._4_4_ + 1) {
      BucketScope.W._0_4_ =
           DataExtractor::getU32
                     (&(this->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor,
                      &HashesBase,(Error *)0x0);
      Twine::Twine(&local_2d0,"Bucket ");
      Twine::Twine(&local_2e8,BucketScope.W._4_4_);
      llvm::operator+(&local_2b8,&local_2d0,&local_2e8);
      Twine::str_abi_cxx11_(&local_2a0,&local_2b8);
      StringRef::StringRef(&local_280,&local_2a0);
      DelimitedScope<'[',_']'>::DelimitedScope(&local_270,(ScopedPrinter *)local_38,local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      if ((uint32_t)BucketScope.W == 0xffffffff) {
        StringRef::StringRef((StringRef *)&HashIdx,"EMPTY");
        ScopedPrinter::printString((ScopedPrinter *)local_38,_HashIdx);
        HashOffset._4_4_ = 6;
      }
      else {
        for (HashOffset._0_4_ = (uint32_t)BucketScope.W; (uint)HashOffset < (this->Hdr).HashCount;
            HashOffset._0_4_ = (uint)HashOffset + 1) {
          OffsetsOffset = lVar7 + (ulong)((uint)HashOffset << 2);
          uStack_310 = lVar7 + (ulong)(uVar1 << 2) + (ulong)((uint)HashOffset << 2);
          uVar3 = DataExtractor::getU32
                            (&(this->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor,
                             &OffsetsOffset,(Error *)0x0);
          if (uVar3 % (this->Hdr).BucketCount != BucketScope.W._4_4_) break;
          uVar4 = DataExtractor::getU32
                            (&(this->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor,
                             &stack0xfffffffffffffcf0,(Error *)0x0);
          HashScope.W = (ScopedPrinter *)(ulong)uVar4;
          Twine::Twine(&local_388,"Hash 0x");
          local_3a8 = (ulong)uVar3;
          Twine::utohexstr(&local_3a0,&local_3a8);
          llvm::operator+(&local_370,&local_388,&local_3a0);
          Twine::str_abi_cxx11_(&local_358,&local_370);
          StringRef::StringRef(&local_338,&local_358);
          DelimitedScope<'[',_']'>::DelimitedScope(&local_328,(ScopedPrinter *)local_38,local_338);
          std::__cxx11::string::~string((string *)&local_358);
          bVar2 = DataExtractor::isValidOffset
                            (&(this->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor,
                             (uint64_t)HashScope.W);
          if (bVar2) {
            do {
              bVar2 = dumpName(this,(ScopedPrinter *)local_38,
                               (SmallVectorImpl<llvm::DWARFFormValue> *)&AtomsScope,
                               (uint64_t *)&HashScope);
            } while (bVar2);
            HashOffset._4_4_ = 0;
          }
          else {
            StringRef::StringRef(&local_3b8,"Invalid section offset");
            ScopedPrinter::printString((ScopedPrinter *)local_38,local_3b8);
            HashOffset._4_4_ = 9;
          }
          DelimitedScope<'[',_']'>::~DelimitedScope(&local_328);
        }
        HashOffset._4_4_ = 0;
      }
      DelimitedScope<'[',_']'>::~DelimitedScope(&local_270);
    }
    SmallVector<llvm::DWARFFormValue,_3U>::~SmallVector
              ((SmallVector<llvm::DWARFFormValue,_3U> *)&AtomsScope);
  }
  return;
}

Assistant:

LLVM_DUMP_METHOD void AppleAcceleratorTable::dump(raw_ostream &OS) const {
  if (!IsValid)
    return;

  ScopedPrinter W(OS);

  Hdr.dump(W);

  W.printNumber("DIE offset base", HdrData.DIEOffsetBase);
  W.printNumber("Number of atoms", uint64_t(HdrData.Atoms.size()));
  SmallVector<DWARFFormValue, 3> AtomForms;
  {
    ListScope AtomsScope(W, "Atoms");
    unsigned i = 0;
    for (const auto &Atom : HdrData.Atoms) {
      DictScope AtomScope(W, ("Atom " + Twine(i++)).str());
      W.startLine() << "Type: " << formatAtom(Atom.first) << '\n';
      W.startLine() << "Form: " << formatv("{0}", Atom.second) << '\n';
      AtomForms.push_back(DWARFFormValue(Atom.second));
    }
  }

  // Now go through the actual tables and dump them.
  uint64_t Offset = sizeof(Hdr) + Hdr.HeaderDataLength;
  uint64_t HashesBase = Offset + Hdr.BucketCount * 4;
  uint64_t OffsetsBase = HashesBase + Hdr.HashCount * 4;

  for (unsigned Bucket = 0; Bucket < Hdr.BucketCount; ++Bucket) {
    unsigned Index = AccelSection.getU32(&Offset);

    ListScope BucketScope(W, ("Bucket " + Twine(Bucket)).str());
    if (Index == UINT32_MAX) {
      W.printString("EMPTY");
      continue;
    }

    for (unsigned HashIdx = Index; HashIdx < Hdr.HashCount; ++HashIdx) {
      uint64_t HashOffset = HashesBase + HashIdx*4;
      uint64_t OffsetsOffset = OffsetsBase + HashIdx*4;
      uint32_t Hash = AccelSection.getU32(&HashOffset);

      if (Hash % Hdr.BucketCount != Bucket)
        break;

      uint64_t DataOffset = AccelSection.getU32(&OffsetsOffset);
      ListScope HashScope(W, ("Hash 0x" + Twine::utohexstr(Hash)).str());
      if (!AccelSection.isValidOffset(DataOffset)) {
        W.printString("Invalid section offset");
        continue;
      }
      while (dumpName(W, AtomForms, &DataOffset))
        /*empty*/;
    }
  }
}